

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int64_t mtree_atol(char **p)

{
  char cVar1;
  char cVar2;
  long lVar3;
  int64_t iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  
  pcVar8 = *p;
  if (*pcVar8 == '0') {
    if ((byte)(pcVar8[1] | 0x20U) != 0x78) {
      uVar7 = 0;
      lVar3 = 0;
      do {
        pcVar8 = pcVar8 + 1;
        if (0xfffffffffffffff < lVar3) {
          return 0x7fffffffffffffff;
        }
        lVar3 = (ulong)uVar7 + lVar3 * 8;
        *p = pcVar8;
        uVar7 = (int)*pcVar8 - 0x30;
      } while (uVar7 < 8);
      return lVar3;
    }
    lVar3 = 0x7ffffffffffffff;
    *p = pcVar8 + 2;
    cVar1 = pcVar8[2];
    uVar5 = 0xf;
    if (cVar1 == '-') {
      *p = pcVar8 + 3;
      lVar3 = 0x800000000000000;
      uVar5 = 0;
    }
    cVar2 = **p;
    iVar6 = (int)cVar2;
    if ((byte)(cVar2 - 0x30U) < 10) {
      uVar7 = iVar6 - 0x30;
    }
    else if ((byte)(cVar2 + 0x9fU) < 6) {
      uVar7 = iVar6 - 0x61;
    }
    else {
      uVar7 = 0xffffffff;
      if ((byte)(cVar2 + 0xbfU) < 6) {
        uVar7 = iVar6 - 0x41;
      }
    }
    lVar9 = 0;
    while( true ) {
      if ((int)uVar7 < 0) {
        lVar3 = -lVar9;
        if (cVar1 != '-') {
          lVar3 = lVar9;
        }
        return lVar3;
      }
      if ((lVar9 != lVar3 && lVar3 <= lVar9) ||
         (uVar10 = (ulong)uVar7, uVar5 < uVar10 && lVar9 == lVar3)) break;
      pcVar8 = *p;
      *p = pcVar8 + 1;
      cVar2 = pcVar8[1];
      iVar6 = (int)cVar2;
      if ((byte)(cVar2 - 0x30U) < 10) {
        uVar7 = iVar6 - 0x30;
      }
      else if ((byte)(cVar2 + 0x9fU) < 6) {
        uVar7 = iVar6 - 0x61;
      }
      else {
        uVar7 = iVar6 - 0x41;
        if (5 < (byte)(cVar2 + 0xbfU)) {
          uVar7 = 0xffffffff;
        }
      }
      lVar9 = lVar9 * 0x10 + uVar10;
    }
    iVar4 = -0x8000000000000000;
    if (cVar1 != '-') {
      iVar4 = 0x7fffffffffffffff;
    }
    return iVar4;
  }
  cVar1 = **p;
  uVar5 = 7;
  if (cVar1 == '-') {
    *p = *p + 1;
    uVar5 = 8;
  }
  uVar7 = (int)**p - 0x30;
  if (uVar7 < 10) {
    lVar3 = 0;
    do {
      if ((0xccccccccccccccc < lVar3) || (uVar5 < uVar7 && lVar3 == 0xccccccccccccccc)) {
        lVar3 = 0x7fffffffffffffff;
        lVar9 = -0x8000000000000000;
        goto LAB_0042ae71;
      }
      lVar3 = (ulong)uVar7 + lVar3 * 10;
      pcVar8 = *p;
      *p = pcVar8 + 1;
      uVar7 = (int)pcVar8[1] - 0x30;
    } while (uVar7 < 10);
  }
  else {
    lVar3 = 0;
  }
  lVar9 = -lVar3;
LAB_0042ae71:
  if (cVar1 != '-') {
    lVar9 = lVar3;
  }
  return lVar9;
}

Assistant:

static int64_t
mtree_atol(char **p)
{
	if (**p != '0')
		return mtree_atol10(p);
	if ((*p)[1] == 'x' || (*p)[1] == 'X') {
		*p += 2;
		return mtree_atol16(p);
	}
	return mtree_atol8(p);
}